

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O2

bool __thiscall SubfloatFlow::createLink(SubfloatFlow *this,ReplaceOp *rop,int4 slot,Varnode *vn)

{
  pointer ppRVar1;
  ReplaceVarnode *pRVar2;
  bool inworklist;
  ReplaceVarnode *rep;
  bool local_41;
  ReplaceVarnode *local_40;
  ReplaceVarnode *local_38;
  
  pRVar2 = setReplacement(this,vn,&local_41);
  if (pRVar2 != (ReplaceVarnode *)0x0) {
    local_38 = pRVar2;
    if (rop != (ReplaceOp *)0x0) {
      if (slot == -1) {
        rop->output = pRVar2;
        pRVar2->def = rop;
      }
      else {
        while (ppRVar1 = (rop->input).
                         super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              (ulong)((long)(rop->input).
                            super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
              (ulong)(long)slot) {
          local_40 = (ReplaceVarnode *)0x0;
          std::vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>::
          emplace_back<SubfloatFlow::ReplaceVarnode*>
                    ((vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>
                      *)&rop->input,&local_40);
        }
        ppRVar1[slot] = pRVar2;
      }
    }
    if (local_41 == true) {
      std::vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>::
      push_back(&this->worklist,&local_38);
    }
  }
  return pRVar2 != (ReplaceVarnode *)0x0;
}

Assistant:

bool SubfloatFlow::createLink(ReplaceOp *rop,int4 slot,Varnode *vn)

{ // Add a new varnode (and the edge which traced to it) to the worklist
  bool inworklist;
  ReplaceVarnode *rep = setReplacement(vn,inworklist);
  if (rep == (ReplaceVarnode *)0) return false;

  if (rop != (ReplaceOp *)0) {
    if (slot == -1) {
      rop->output = rep;
      rep->def = rop;
    }
    else {
      while(rop->input.size() <= slot)
	rop->input.push_back((ReplaceVarnode *)0);
      rop->input[slot] = rep;
    }
  }

  if (inworklist)
    worklist.push_back(rep);
  return true;
}